

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O1

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,StringPtr bindAddress,uint defaultPort,
          ReaderOptions readerOpts)

{
  _Rb_tree_header *p_Var1;
  Disposer *pDVar2;
  ForkHub<unsigned_int> *pFVar3;
  undefined8 uVar4;
  PromiseNode *pPVar5;
  long *plVar6;
  int iVar7;
  undefined4 extraout_var;
  PromiseFulfillerPair<unsigned_int> paf;
  undefined1 local_a0 [16];
  Promise<void> local_90;
  PromiseFulfiller<unsigned_int> *local_80;
  long *local_78;
  undefined8 *local_70;
  long *plStack_68;
  Promise<unsigned_int> local_60;
  int local_50;
  undefined8 *local_48;
  long *plStack_40;
  Own<kj::_::PromiseNode> local_38;
  
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00647e30;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00647e58;
  (this->mainInterface).hook.disposer = (mainInterface->hook).disposer;
  (this->mainInterface).hook.ptr = (mainInterface->hook).ptr;
  (mainInterface->hook).ptr = (ClientHook *)0x0;
  EzRpcContext::getThreadLocal();
  p_Var1 = &(this->exportMap)._M_t._M_impl.super__Rb_tree_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->portPromise).hub.disposer = (Disposer *)0x0;
  (this->portPromise).hub.ptr = (ForkHub<unsigned_int> *)0x0;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  kj::newPromiseAndFulfiller<unsigned_int>();
  kj::Promise<unsigned_int>::fork(&local_60);
  pDVar2 = (this->portPromise).hub.disposer;
  pFVar3 = (this->portPromise).hub.ptr;
  (this->portPromise).hub.disposer = local_60.super_PromiseBase.node.disposer;
  (this->portPromise).hub.ptr = (ForkHub<unsigned_int> *)local_60.super_PromiseBase.node.ptr;
  local_60.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (pFVar3 != (ForkHub<unsigned_int> *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar3->super_ForkHubBase).super_Refcounted.super_Disposer.
                              _vptr_Disposer +
                      (long)(pFVar3->super_ForkHubBase).super_Refcounted.super_Disposer.
                            _vptr_Disposer[-2]));
  }
  pPVar5 = local_60.super_PromiseBase.node.ptr;
  if (local_60.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_60.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_60.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_60.super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar5->_vptr_PromiseNode + (long)pPVar5->_vptr_PromiseNode[-2])
              );
  }
  iVar7 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar7))
            (local_a0,(undefined8 *)CONCAT44(extraout_var,iVar7),bindAddress.content.ptr,
             bindAddress.content.size_,defaultPort);
  local_50 = readerOpts.nestingLimit;
  local_60.super_PromiseBase.node.ptr = (PromiseNode *)readerOpts.traversalLimitInWords;
  local_48 = local_70;
  plStack_40 = plStack_68;
  plStack_68 = (long *)0x0;
  local_60.super_PromiseBase.node.disposer = (Disposer *)this;
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::NetworkAddress>,kj::CaptureByMove<capnp::EzRpcServer::Impl::Impl(capnp::Capability::Client,kj::StringPtr,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::PromiseFulfiller<unsigned_int>>&&,kj::Own<kj::NetworkAddress>&&)_1_,kj::Own<kj::PromiseFulfiller<unsigned_int>>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::EzRpcServer::Impl::Impl(capnp::Capability::Client,kj::StringPtr,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::PromiseFulfiller<unsigned_int>>&&,kj::Own<kj::NetworkAddress>&&)_1_,kj::Own<kj::PromiseFulfiller<unsigned_int>>>,kj::_::PropagateException>
            (&local_38,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:264:11),_kj::Own<kj::PromiseFulfiller<unsigned_int>_>_>
              *)local_a0,(PropagateException *)&local_60);
  local_90.super_PromiseBase.node.disposer = local_38.disposer;
  local_90.super_PromiseBase.node.ptr = local_38.ptr;
  kj::TaskSet::add(&this->tasks,&local_90);
  pPVar5 = local_90.super_PromiseBase.node.ptr;
  if ((Disposer *)local_90.super_PromiseBase.node.ptr != (Disposer *)0x0) {
    local_90.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_90.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_90.super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar5->_vptr_PromiseNode + (long)pPVar5->_vptr_PromiseNode[-2])
              );
  }
  plVar6 = plStack_40;
  if (plStack_40 != (long *)0x0) {
    plStack_40 = (long *)0x0;
    (**(code **)*local_48)(local_48,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  uVar4 = local_a0._8_8_;
  if ((long *)local_a0._8_8_ != (long *)0x0) {
    local_a0._8_8_ = (long *)0x0;
    (**(((SturdyRefRestorer<capnp::AnyPointer> *)local_a0._0_8_)->super_SturdyRefRestorerBase).
       _vptr_SturdyRefRestorerBase)(local_a0._0_8_,uVar4 + *(long *)(*(long *)uVar4 + -0x10));
  }
  plVar6 = plStack_68;
  if (plStack_68 != (long *)0x0) {
    plStack_68 = (long *)0x0;
    (**(code **)*local_70)(local_70,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  plVar6 = local_78;
  if (local_78 != (long *)0x0) {
    local_78 = (long *)0x0;
    (**local_80->_vptr_PromiseFulfiller)(local_80,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  return;
}

Assistant:

Impl(Capability::Client mainInterface, kj::StringPtr bindAddress, uint defaultPort,
       ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()), portPromise(nullptr), tasks(*this) {
    auto paf = kj::newPromiseAndFulfiller<uint>();
    portPromise = paf.promise.fork();

    tasks.add(context->getIoProvider().getNetwork().parseAddress(bindAddress, defaultPort)
        .then(kj::mvCapture(paf.fulfiller,
          [this, readerOpts](kj::Own<kj::PromiseFulfiller<uint>>&& portFulfiller,
                             kj::Own<kj::NetworkAddress>&& addr) {
      auto listener = addr->listen();
      portFulfiller->fulfill(listener->getPort());
      acceptLoop(kj::mv(listener), readerOpts);
    })));
  }